

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindowPrivate::setSizeGripVisible(QMdiSubWindowPrivate *this,bool visible)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  QMdiSubWindow *pQVar4;
  const_iterator o;
  QSizeGrip **ppQVar5;
  byte in_SIL;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QSizeGrip *grip;
  QList<QSizeGrip_*> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QSizeGrip_*> sizeGrips;
  QList<QSizeGrip_*> *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb0;
  const_iterator local_30;
  QFlagsStorage<Qt::FindChildOption> in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_SIL & 1;
  pQVar4 = q_func(in_RDI);
  QFlags<Qt::FindChildOption>::QFlags
            ((QFlags<Qt::FindChildOption> *)in_stack_ffffffffffffffa0,
             (FindChildOption)((ulong)pQVar4 >> 0x20));
  QObject::findChildren<QSizeGrip*>
            ((QObject *)CONCAT17(bVar2,in_stack_ffffffffffffffb0),
             (FindChildOptions)in_stack_ffffffffffffffdc.i);
  local_30.i = (QSizeGrip **)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QList<QSizeGrip_*>::begin(in_stack_ffffffffffffffa0);
  o = QList<QSizeGrip_*>::end(in_stack_ffffffffffffffa0);
  while( true ) {
    bVar3 = QList<QSizeGrip_*>::const_iterator::operator!=(&local_30,o);
    if (!bVar3) break;
    ppQVar5 = QList<QSizeGrip_*>::const_iterator::operator*(&local_30);
    (**(code **)(*(long *)&(*ppQVar5)->super_QWidget + 0x68))(*ppQVar5,bVar2 & 1);
    QList<QSizeGrip_*>::const_iterator::operator++(&local_30);
  }
  QList<QSizeGrip_*>::~QList((QList<QSizeGrip_*> *)0x631142);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::setSizeGripVisible(bool visible) const
{
    // See if we can find any size grips
    const QList<QSizeGrip *> sizeGrips = q_func()->findChildren<QSizeGrip *>();
    for (QSizeGrip *grip : sizeGrips)
        grip->setVisible(visible);
}